

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPersistentManifold.h
# Opt level: O0

void __thiscall
btPersistentManifold::btPersistentManifold
          (btPersistentManifold *this,btCollisionObject *body0,btCollisionObject *body1,int param_4,
          btScalar contactBreakingThreshold,btScalar contactProcessingThreshold)

{
  btManifoldPoint *pbVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  btManifoldPoint *in_RDI;
  btScalar in_XMM0_Da;
  btScalar in_XMM1_Da;
  btScalar *local_30;
  
  btTypedObject::btTypedObject((btTypedObject *)in_RDI,0x401);
  local_30 = (in_RDI->m_localPointA).m_floats + 2;
  pbVar1 = in_RDI + 4;
  do {
    btManifoldPoint::btManifoldPoint(in_RDI);
    local_30 = local_30 + 0x30;
  } while (local_30 != (pbVar1->m_localPointA).m_floats + 2);
  *(undefined8 *)(in_RDI[4].m_localPointA.m_floats + 2) = in_RSI;
  *(undefined8 *)in_RDI[4].m_localPointB.m_floats = in_RDX;
  in_RDI[4].m_localPointB.m_floats[2] = 0.0;
  in_RDI[4].m_localPointB.m_floats[3] = in_XMM0_Da;
  in_RDI[4].m_positionWorldOnB.m_floats[0] = in_XMM1_Da;
  return;
}

Assistant:

btPersistentManifold(const btCollisionObject* body0,const btCollisionObject* body1,int , btScalar contactBreakingThreshold,btScalar contactProcessingThreshold)
		: btTypedObject(BT_PERSISTENT_MANIFOLD_TYPE),
	m_body0(body0),m_body1(body1),m_cachedPoints(0),
		m_contactBreakingThreshold(contactBreakingThreshold),
		m_contactProcessingThreshold(contactProcessingThreshold)
	{
	}